

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

Roaring64Map *
roaring::Roaring64Map::readSafe(Roaring64Map *__return_storage_ptr__,char *buf,size_t maxbytes)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  size_t sVar3;
  runtime_error *prVar4;
  long lVar5;
  ulong uVar6;
  uint *puVar7;
  Roaring read_var;
  uint local_64;
  Roaring64Map *local_60;
  roaring_bitmap_t local_58;
  
  if (maxbytes < 8) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"ran out of bytes");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var1 = &(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->copyOnWrite = false;
  lVar5 = *(long *)buf;
  if (lVar5 != 0) {
    uVar6 = maxbytes - 8;
    puVar7 = (uint *)(buf + 8);
    local_60 = __return_storage_ptr__;
    do {
      if (uVar6 < 4) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"ran out of bytes");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar2 = *puVar7;
      Roaring::readSafe((Roaring *)&local_58,(char *)(puVar7 + 1),uVar6 - 4);
      sVar3 = roaring_bitmap_portable_size_in_bytes(&local_58);
      __return_storage_ptr__ = local_60;
      local_64 = uVar2;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
      ::_M_emplace_unique<unsigned_int_const&,roaring::Roaring>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                  *)local_60,&local_64,(Roaring *)&local_58);
      uVar6 = (uVar6 - 4) - sVar3;
      puVar7 = (uint *)((long)(puVar7 + 1) + sVar3);
      Roaring::~Roaring((Roaring *)&local_58);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static Roaring64Map readSafe(const char *buf, size_t maxbytes) {
        if (maxbytes < sizeof(uint64_t)) {
            ROARING_TERMINATE("ran out of bytes");
        }
        Roaring64Map result;
        uint64_t map_size;
        std::memcpy(&map_size, buf, sizeof(uint64_t));
        buf += sizeof(uint64_t);
        maxbytes -= sizeof(uint64_t);
        for (uint64_t lcv = 0; lcv < map_size; lcv++) {
            if (maxbytes < sizeof(uint32_t)) {
                ROARING_TERMINATE("ran out of bytes");
            }
            uint32_t key;
            std::memcpy(&key, buf, sizeof(uint32_t));
            // ^-- Note: `uint32_t key = *((uint32_t*)buf);` is undefined

            buf += sizeof(uint32_t);
            maxbytes -= sizeof(uint32_t);
            // read map value Roaring
            Roaring read_var = Roaring::readSafe(buf, maxbytes);
            // forward buffer past the last Roaring Bitmap
            size_t tz = read_var.getSizeInBytes(true);
            buf += tz;
            maxbytes -= tz;
            result.emplaceOrInsert(key, std::move(read_var));
        }
        return result;
    }